

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast_usingDict
              (char *source,char *dest,int originalSize,char *dictStart,int dictSize)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  ushort *puVar5;
  ulong uVar6;
  size_t l_1;
  size_t dictSize_00;
  uint uVar7;
  size_t l;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  byte *__src;
  ushort *puVar12;
  int local_40;
  
  if (dictSize == 0) {
    dictSize_00 = 0;
  }
  else {
    dictSize_00 = (size_t)dictSize;
    if (dictStart + dictSize_00 != dest) {
      iVar3 = LZ4_decompress_fast_extDict(source,dest,originalSize,dictStart,dictSize_00);
      return iVar3;
    }
  }
  pcVar10 = dest + originalSize;
  lVar4 = (long)dest - dictSize_00;
  local_40 = -1;
  puVar5 = (ushort *)source;
  while( true ) {
    uVar2 = *puVar5;
    __src = (byte *)((long)puVar5 + 1);
    uVar7 = (uint)(byte)((byte)uVar2 >> 4);
    uVar9 = (ulong)uVar7;
    if (uVar7 == 0xf) {
      lVar8 = 0;
      do {
        bVar1 = *__src;
        __src = __src + 1;
        lVar8 = lVar8 + (ulong)bVar1;
      } while ((ulong)bVar1 == 0xff);
      uVar9 = lVar8 + 0xf;
    }
    if ((ulong)((long)pcVar10 - (long)dest) < uVar9) {
      return -1;
    }
    memmove(dest,__src,uVar9);
    pcVar11 = dest + uVar9;
    puVar12 = (ushort *)(__src + uVar9);
    if ((ulong)((long)pcVar10 - (long)pcVar11) < 0xc) {
      if (pcVar11 == pcVar10) {
        local_40 = (int)source;
        local_40 = (int)puVar12 - local_40;
      }
      return local_40;
    }
    uVar9 = (ulong)((byte)uVar2 & 0xf);
    puVar5 = puVar12 + 1;
    if (uVar9 == 0xf) {
      lVar8 = 0;
      do {
        uVar2 = *puVar5;
        puVar5 = (ushort *)((long)puVar5 + 1);
        lVar8 = lVar8 + (ulong)(byte)uVar2;
      } while ((ulong)(byte)uVar2 == 0xff);
      uVar9 = lVar8 + 0xf;
    }
    uVar9 = uVar9 + 4;
    if ((ulong)((long)pcVar10 - (long)pcVar11) < uVar9) break;
    uVar2 = *puVar12;
    if ((ulong)((long)pcVar11 - lVar4) < (ulong)uVar2) {
      return -1;
    }
    if (uVar9 != 0) {
      uVar6 = 0;
      do {
        pcVar11[uVar6] = pcVar11[uVar6 - uVar2];
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
    }
    dest = pcVar11 + uVar9;
    if ((ulong)((long)pcVar10 - (long)dest) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int LZ4_decompress_fast_usingDict(const char* source, char* dest, int originalSize, const char* dictStart, int dictSize)
{
    if (dictSize==0 || dictStart+dictSize == dest)
        return LZ4_decompress_unsafe_generic(
                        (const BYTE*)source, (BYTE*)dest, originalSize,
                        (size_t)dictSize, NULL, 0);
    assert(dictSize >= 0);
    return LZ4_decompress_fast_extDict(source, dest, originalSize, dictStart, (size_t)dictSize);
}